

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O2

SymbolTable * __thiscall flow::lang::Parser::leaveScope(Parser *this)

{
  SymbolTable *pSVar1;
  
  pSVar1 = this->scopeStack_;
  this->scopeStack_ = pSVar1->outerTable_;
  return pSVar1;
}

Assistant:

SymbolTable* Parser::leaveScope() {
  SymbolTable* popped = scopeStack_;
  scopeStack_ = scopeStack_->outerTable();

  // printf("Parser::leaveScope(): new top: %p \"%s\" (outer: %p \"%s\")\n", popped,
  // popped->name().c_str(), scopeStack_, scopeStack_ ?
  // scopeStack_->name().c_str() : "");

  return popped;
}